

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall
Lowerer::LowerBailOnIntMin
          (Lowerer *this,Instr *instr,BranchInstr *branchInstr,LabelInstr *labelBailOut)

{
  code *pcVar1;
  bool bVar2;
  BailOutKind BVar3;
  undefined4 *puVar4;
  LabelInstr *target;
  Opnd *compareSrc1;
  IntConstOpnd *pIVar5;
  Lowerer *this_00;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x32ff,"(instr)","instr");
    if (!bVar2) goto LAB_00577423;
    *puVar4 = 0;
  }
  if (instr->m_src1 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3300,"(instr->GetSrc1())","instr->GetSrc1()");
    if (!bVar2) goto LAB_00577423;
    *puVar4 = 0;
  }
  target = IR::LabelInstr::New(Label,this->m_func,false);
  IR::Instr::InsertAfter(instr,&target->super_Instr);
  if ((instr->field_0x38 & 0x10) != 0) {
    BVar3 = IR::Instr::GetBailOutKind(instr);
    if (BVar3 != BailOnIntMin) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x330a,"(instr->GetBailOutKind() == IR::BailOnIntMin)",
                         "instr->GetBailOutKind() == IR::BailOnIntMin");
      if (!bVar2) {
LAB_00577423:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    bVar2 = IR::Opnd::IsIntConstOpnd(instr->m_src1);
    compareSrc1 = IR::Instr::UnlinkSrc1(instr);
    if (!bVar2) {
      this_00 = (Lowerer *)0xffffffff80000000;
      pIVar5 = IR::IntConstOpnd::New(-0x80000000,TyInt32,this->m_func,false);
      InsertCompareBranch(this_00,compareSrc1,&pIVar5->super_Opnd,BrNeq_A,target,instr,false);
      GenerateBailOut(this,instr,branchInstr,labelBailOut,(LabelInstr *)0x0);
      return &target->super_Instr;
    }
    pIVar5 = IR::Opnd::AsIntConstOpnd(compareSrc1);
    if ((pIVar5->super_EncodableOpnd<long>).m_value == -0x80000000) {
      GenerateBailOut(this,instr,branchInstr,labelBailOut,(LabelInstr *)0x0);
      IR::Opnd::Free(&pIVar5->super_Opnd,instr->m_func);
      return &target->super_Instr;
    }
  }
  IR::Instr::Remove(instr);
  return &target->super_Instr;
}

Assistant:

IR::Instr *
Lowerer::LowerBailOnIntMin(IR::Instr *instr, IR::BranchInstr *branchInstr  /* = nullptr */, IR::LabelInstr  *labelBailOut /* = nullptr */)
{
    Assert(instr);
    Assert(instr->GetSrc1());
    IR::LabelInstr *continueLabelInstr = IR::LabelInstr::New(Js::OpCode::Label, m_func);
    instr->InsertAfter(continueLabelInstr);

    if(!instr->HasBailOutInfo())
    {
        instr->Remove();
    }
    else
    {
        Assert(instr->GetBailOutKind() == IR::BailOnIntMin);
        // Note: src1 must be int32 at this point.
        if (instr->GetSrc1()->IsIntConstOpnd())
        {
            // For consts we can check the value at JIT time. Note: without this check we'll have to legalize the CMP instr.
            IR::IntConstOpnd* intConst = instr->UnlinkSrc1()->AsIntConstOpnd();
            if (intConst->GetValue() == INT_MIN)
            {
                this->GenerateBailOut(instr, branchInstr, labelBailOut);
                intConst->Free(instr->m_func);
            }
            else
            {
                instr->Remove();
            }
        }
        else
        {
            InsertCompareBranch(instr->UnlinkSrc1(), IR::IntConstOpnd::New(INT_MIN, TyInt32, this->m_func), Js::OpCode::BrNeq_A, continueLabelInstr, instr);
            this->GenerateBailOut(instr, branchInstr, labelBailOut);
        }
    }

    return continueLabelInstr;
}